

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::GLSL420Pack::InitializerListNegativeTest::getInitialization_abi_cxx11_
          (string *__return_storage_ptr__,InitializerListNegativeTest *this)

{
  reference pvVar1;
  TestError *this_00;
  TESTED_ERRORS *error;
  InitializerListNegativeTest *this_local;
  string *initialization;
  
  pvVar1 = std::
           vector<gl4cts::GLSL420Pack::InitializerListNegativeTest::TESTED_ERRORS,_std::allocator<gl4cts::GLSL420Pack::InitializerListNegativeTest::TESTED_ERRORS>_>
           ::operator[](&this->m_test_cases,(long)this->m_current_test_case_index);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  switch(*pvVar1) {
  case TYPE_UIVEC_BOOL:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"{ true, 0, 1, 2 }");
    break;
  case TYPE_IVEC_BOOL:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"{ true, 0, -1, 2 }");
    break;
  case TYPE_VEC_BOOL:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"{ true, 0.125, 0.25, 0.375 }")
    ;
    break;
  case TYPE_MAT_BOOL:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "{ {false, 0, 1, 1}, {0, 1, 0, 1}, {1, 0, 1, 0}, {0, 1, 0, 1} }");
    break;
  case COMPONENTS_VEC_LESS:
  case COMPONENTS_VEC_MORE:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"{ 0, 0.25, 0.375 }");
    break;
  case COMPONENTS_MAT_LESS_ROWS:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "{ {0, 0, 1, 1}, {0, 0, 1}, {1, 0, 1, 0}, {0, 1, 0, 1} }");
    break;
  case COMPONENTS_MAT_LESS_COLUMNS:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"{ {0, 0, 1, 1}, {1, 0, 1, 0}, {0, 1, 0, 1} }");
    break;
  case COMPONENTS_MAT_MORE_ROWS:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"{ {0, 0, 1}, {0, 0, 1}, {1, 0, 1, 0}, {1, 0, 1} }")
    ;
    break;
  case COMPONENTS_MAT_MORE_COLUMNS:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"{ {0, 0, 1}, {0, 0, 1}, {1, 0, 1}, {1, 0, 1} }");
    break;
  case LIST_IN_CONSTRUCTOR:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Struct( { vec4(0, 1, 0, 1), vec3(0, 1, 0) }, vec4(1, 0, 1, 0) )");
    break;
  case STRUCT_LAYOUT_MEMBER_TYPE:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "{ { {0, 1, 0, 1}, vec4(0, 1, 0, 1) }, vec4(1, 0, 1, 0) }");
    break;
  case STRUCT_LAYOUT_MEMBER_COUNT_MORE:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "{ { {0, 1, 0, 1}, vec3(0, 1, 0) } , vec4(1, 0, 1, 0), vec4(1, 0, 1, 0) }");
    break;
  case STRUCT_LAYOUT_MEMBER_COUNT_LESS:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"{ { {0, 1, 0, 1}, vec3(0, 1, 0) } }");
    break;
  case STRUCT_LAYOUT_MEMBER_ORDER:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "{ vec4(1, 0, 1, 0), { vec3(0, 1, 0) , {0, 1, 0, 1} } }");
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
               ,0x3a9d);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InitializerListNegativeTest::getInitialization()
{
	const TESTED_ERRORS& error = m_test_cases[m_current_test_case_index];

	std::string initialization;

	switch (error)
	{
	case TYPE_UIVEC_BOOL:
		initialization = "{ true, 0, 1, 2 }";

		break;

	case TYPE_IVEC_BOOL:
		initialization = "{ true, 0, -1, 2 }";

		break;

	case TYPE_VEC_BOOL:
		initialization = "{ true, 0.125, 0.25, 0.375 }";

		break;

	case TYPE_MAT_BOOL:
		initialization = "{ {false, 0, 1, 1}, {0, 1, 0, 1}, {1, 0, 1, 0}, {0, 1, 0, 1} }";

		break;

	case COMPONENTS_VEC_LESS:
	case COMPONENTS_VEC_MORE:
		initialization = "{ 0, 0.25, 0.375 }";

		break;

	case COMPONENTS_MAT_LESS_ROWS:
		initialization = "{ {0, 0, 1, 1}, {0, 0, 1}, {1, 0, 1, 0}, {0, 1, 0, 1} }";

		break;

	case COMPONENTS_MAT_MORE_ROWS:
		initialization = "{ {0, 0, 1}, {0, 0, 1}, {1, 0, 1, 0}, {1, 0, 1} }";

		break;

	case COMPONENTS_MAT_LESS_COLUMNS:
		initialization = "{ {0, 0, 1, 1}, {1, 0, 1, 0}, {0, 1, 0, 1} }";

		break;

	case COMPONENTS_MAT_MORE_COLUMNS:
		initialization = "{ {0, 0, 1}, {0, 0, 1}, {1, 0, 1}, {1, 0, 1} }";

		break;

	case LIST_IN_CONSTRUCTOR:
		initialization = "Struct( { vec4(0, 1, 0, 1), vec3(0, 1, 0) }, vec4(1, 0, 1, 0) )";

		break;

	case STRUCT_LAYOUT_MEMBER_TYPE:
		initialization = "{ { {0, 1, 0, 1}, vec4(0, 1, 0, 1) }, vec4(1, 0, 1, 0) }";

		break;

	case STRUCT_LAYOUT_MEMBER_COUNT_MORE:
		initialization = "{ { {0, 1, 0, 1}, vec3(0, 1, 0) } , vec4(1, 0, 1, 0), vec4(1, 0, 1, 0) }";

		break;

	case STRUCT_LAYOUT_MEMBER_COUNT_LESS:
		initialization = "{ { {0, 1, 0, 1}, vec3(0, 1, 0) } }";

		break;

	case STRUCT_LAYOUT_MEMBER_ORDER:
		initialization = "{ vec4(1, 0, 1, 0), { vec3(0, 1, 0) , {0, 1, 0, 1} } }";

		break;

	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	return initialization;
}